

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.h
# Opt level: O1

void * __thiscall re2::Prog::PrefixAccel(Prog *this,void *data,size_t size)

{
  int __c;
  int iVar1;
  uint64_t *puVar2;
  ulong uVar3;
  long lVar4;
  void *pvVar5;
  uint64_t *puVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  
  if (this->prefix_size_ == 0) {
    __assert_fail("can_prefix_accel()",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/prog.h"
                  ,0xe0,"const void *re2::Prog::PrefixAccel(const void *, size_t)");
  }
  if (this->prefix_foldcase_ != true) {
    if (this->prefix_size_ == 1) {
      pvVar5 = memchr(data,(this->field_11).field_1.prefix_front_,size);
      return pvVar5;
    }
    uVar3 = this->prefix_size_;
    if (uVar3 < 2) {
      __assert_fail("(prefix_size_) >= (2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/prog.cc"
                    ,0x46b,"const void *re2::Prog::PrefixAccel_FrontAndBack(const void *, size_t)");
    }
    if (size < uVar3) {
      pvVar5 = (void *)0x0;
    }
    else {
      uVar10 = (size - uVar3) + 1;
      __c = (this->field_11).field_1.prefix_front_;
      iVar1 = (this->field_11).field_1.prefix_back_;
      uVar9 = 0;
      pvVar5 = data;
      while ((pvVar5 = memchr(pvVar5,__c,uVar10 - uVar9), pvVar5 != (void *)0x0 &&
             (iVar1 != *(char *)((long)pvVar5 + (uVar3 - 1))))) {
        pvVar5 = (void *)((long)pvVar5 + 1);
        uVar9 = (long)pvVar5 - (long)data;
        if (uVar10 < uVar9) {
          __assert_fail("(size) >= (static_cast<size_t>(p-p0))",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/prog.cc"
                        ,0x490,
                        "const void *re2::Prog::PrefixAccel_FrontAndBack(const void *, size_t)");
        }
      }
    }
    return pvVar5;
  }
  uVar3 = this->prefix_size_;
  if (size < uVar3) {
    return (void *)0x0;
  }
  if (size < 8) {
    uVar9 = 0;
  }
  else {
    puVar2 = (this->field_11).prefix_dfa_;
    puVar6 = puVar2;
    uVar10 = 0;
    pbVar11 = (byte *)data;
    do {
      uVar17 = puVar2[*pbVar11] >> ((byte)uVar10 & 0x3f);
      uVar19 = puVar2[pbVar11[1]] >> ((byte)uVar17 & 0x3f);
      uVar18 = puVar2[pbVar11[2]] >> ((byte)uVar19 & 0x3f);
      uVar14 = puVar2[pbVar11[3]] >> ((byte)uVar18 & 0x3f);
      uVar16 = puVar2[pbVar11[4]] >> ((byte)uVar14 & 0x3f);
      uVar15 = puVar2[pbVar11[5]] >> ((byte)uVar16 & 0x3f);
      uVar12 = puVar2[pbVar11[6]] >> ((byte)uVar15 & 0x3f);
      uVar9 = puVar2[pbVar11[7]] >> ((byte)uVar12 & 0x3f);
      uVar8 = (uint)uVar9 & 0x3f;
      if (uVar8 == 0x36) {
        uVar9 = uVar10;
        if ((0x36U - (int)uVar17 & 0x3f) == 0) {
          pbVar7 = pbVar11 + 1;
        }
        else if ((0x36U - (int)uVar19 & 0x3f) == 0) {
          pbVar7 = pbVar11 + 2;
        }
        else if ((0x36U - (int)uVar18 & 0x3f) == 0) {
          pbVar7 = pbVar11 + 3;
        }
        else if ((0x36U - (int)uVar14 & 0x3f) == 0) {
          pbVar7 = pbVar11 + 4;
        }
        else if ((0x36U - (int)uVar16 & 0x3f) == 0) {
          pbVar7 = pbVar11 + 5;
        }
        else if ((0x36U - (int)uVar15 & 0x3f) == 0) {
          pbVar7 = pbVar11 + 6;
        }
        else {
          if ((0x36U - (int)uVar12 & 0x3f) != 0) {
            puVar6 = (uint64_t *)(pbVar11 + -uVar3 + 8);
            goto LAB_0025c172;
          }
          pbVar7 = pbVar11 + 7;
        }
        puVar6 = (uint64_t *)(pbVar7 + -uVar3);
      }
      else {
        pbVar11 = pbVar11 + 8;
      }
LAB_0025c172:
      if (uVar8 == 0x36) goto LAB_0025c19b;
      uVar10 = uVar9;
    } while (pbVar11 != (byte *)((size & 0xfffffffffffffff8) + (long)data));
    size = (size_t)((uint)size & 7);
    data = pbVar11;
LAB_0025c19b:
    if (uVar8 == 0x36) {
      return puVar6;
    }
  }
  sVar13 = 0;
  do {
    if (size == sVar13) {
      return (void *)0x0;
    }
    uVar9 = (this->field_11).prefix_dfa_[*(byte *)((long)data + sVar13)] >> ((byte)uVar9 & 0x3f);
    lVar4 = sVar13 + (1 - uVar3);
    sVar13 = sVar13 + 1;
  } while (((uint)uVar9 & 0x3f) != 0x36);
  return (byte *)((long)data + lVar4);
}

Assistant:

bool can_prefix_accel() { return prefix_size_ != 0; }